

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O1

void __thiscall
deqp::gls::StateChangePerformanceCase::requireTextures(StateChangePerformanceCase *this,int count)

{
  iterator __position;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  GLuint texture;
  int local_70;
  int local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> textureData;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((int)((ulong)((long)(this->m_textures).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_textures).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->m_textures,(long)count)
    ;
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = count;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&textureData,0x4000);
    iVar5 = 0;
    iVar2 = 0;
    do {
      uVar8 = 0;
      uVar7 = 0;
      local_6c = iVar2;
      do {
        texture = CONCAT31(texture._1_3_,(char)((uint)(iVar2 * 0xff) >> 6));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,(char)(uVar7 >> 6));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,(char)(uVar8 >> 0xc));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,0xff);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        iVar1 = local_70;
        uVar6 = (int)uVar7 + 0xff;
        uVar7 = (ulong)uVar6;
        uVar8 = (ulong)(uint)((int)uVar8 + iVar5);
      } while (uVar6 != 0x3fc0);
      iVar2 = local_6c + 1;
      iVar5 = iVar5 + 0xff;
    } while (iVar2 != 0x40);
    iVar2 = (int)((ulong)((long)(this->m_textures).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_textures).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    while (iVar2 < iVar1) {
      (**(code **)(lVar4 + 0x6f8))(1,&texture);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGenTextures()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x161);
      (**(code **)(lVar4 + 0xb8))(0xde1,texture);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindTexture()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x164);
      (**(code **)(lVar4 + 0x1310))
                (0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,
                 textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexImage2D()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x167);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2600);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16a);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16c);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x2901);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16e);
      (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x2901);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x170);
      (**(code **)(lVar4 + 0xb8))(0xde1,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindTexture()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x173);
      __position._M_current =
           (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_textures,__position
                   ,&texture);
      }
      else {
        *__position._M_current = texture;
        (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar2 = (int)((ulong)((long)(this->m_textures).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_textures).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    if (textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)textureData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)textureData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireTextures (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	const int textureWidth	= 64;
	const int textureHeight	= 64;

	if ((int)m_textures.size() >= count)
		return;

	m_textures.reserve(count);

	vector<deUint8> textureData;
	genTextureData(textureData, textureWidth, textureHeight);

	DE_ASSERT(textureData.size() == textureWidth * textureHeight * 4);

	while ((int)m_textures.size() < count)
	{
		GLuint texture;

		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");

		gl.bindTexture(GL_TEXTURE_2D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

		gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, textureWidth, textureHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(textureData[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

		m_textures.push_back(texture);
	}
}